

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

string * __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::ES>::
recursively_initialise
          (string *__return_storage_ptr__,
          ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::ES> *this,
          string *var_type,size_t dimension_index,string *init_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  byte bVar4;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  long lVar8;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_120;
  long *local_100;
  char *local_f8;
  long local_f0;
  long lStack_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::ES> *local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_d8 = this;
  if (dimension_index == 0) {
    pcVar2 = (var_type->_M_dataplus)._M_p;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar2,pcVar2 + var_type->_M_string_length);
    std::__cxx11::string::append((char *)local_d0);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_d0,(ulong)(init_string->_M_dataplus)._M_p);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_120.field_2._M_allocated_capacity = *psVar6;
      local_120.field_2._8_8_ = plVar5[3];
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar6;
      local_120._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_120._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_f0 = *plVar7;
      lStack_e8 = plVar5[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *plVar7;
      local_100 = (long *)*plVar5;
    }
    local_f8 = (char *)plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    plVar5 = local_d0[0];
    if (local_d0[0] == local_c0) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"\n","");
    if (dimension_index < 9) {
      lVar8 = dimension_index - 9;
      do {
        std::__cxx11::string::append((char *)&local_100);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
    }
    pcVar2 = (var_type->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + var_type->_M_string_length);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"[]","");
    (*(local_d8->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[6])(&local_120,local_d8,local_50,local_70,dimension_index);
    std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_e0 = paVar1;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::__cxx11::string::append((char *)&local_100);
    bVar4 = 1;
    do {
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_100);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar2 = (var_type->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + var_type->_M_string_length);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar2 = (init_string->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + init_string->_M_string_length);
      recursively_initialise(&local_120,local_d8,&local_90,dimension_index - 1,&local_b0);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_120._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x1a8a360);
      bVar3 = (bool)(dimension_index != 1 & bVar4);
      bVar4 = 0;
    } while (bVar3);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_c0[0] = local_f0;
    plVar5 = local_100;
    if (local_100 == &local_f0) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(plVar5,local_c0[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string ConstructorsAndUnsizedDeclStructConstructors<API>::recursively_initialise(std::string var_type,
																					  size_t	  dimension_index,
																					  std::string init_string)
{
	std::string temp_string;

	if (dimension_index == 0)
	{
		temp_string = var_type + "(" + init_string + ")";
	}
	else
	{
		std::string prefix = "\n";

		for (size_t indent_index = dimension_index; indent_index < (API::MAX_ARRAY_DIMENSIONS + 1); indent_index++)
		{
			prefix += "    ";
		}

		prefix += this->extend_string(var_type, "[]", dimension_index);
		prefix += "(";

		for (int sub_script_index = 0; sub_script_index < 2; sub_script_index++)
		{
			temp_string += prefix;
			temp_string += recursively_initialise(var_type, dimension_index - 1, init_string);
			prefix = ", ";

			if (dimension_index == 1)
			{
				break;
			}
		}
		temp_string += ")";
	}

	return temp_string;
}